

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

deUint32 *
vk::BinaryRegistryDetail::BinaryIndexHashImpl_find(BinaryIndexHashImpl *hash,ProgramBinary *key)

{
  BinaryIndexHashImplSlot *pBVar1;
  deUint32 dVar2;
  deBool dVar3;
  long lVar4;
  deUint32 *pdVar5;
  BinaryIndexHashImplSlot **ppBVar6;
  
  if (0 < hash->numElements) {
    dVar2 = anon_unknown_8::binaryHash(key);
    ppBVar6 = hash->slotTable + (int)(hash->slotTableSize - 1U & dVar2);
    while (pBVar1 = *ppBVar6, pBVar1 != (BinaryIndexHashImplSlot *)0x0) {
      pdVar5 = (deUint32 *)((long)pBVar1->keys + 0x1c);
      lVar4 = 0;
      while (lVar4 < pBVar1->numUsed) {
        dVar3 = anon_unknown_8::binaryEqual(pBVar1->keys[lVar4],key);
        lVar4 = lVar4 + 1;
        pdVar5 = pdVar5 + 1;
        if (dVar3 != 0) {
          return pdVar5;
        }
      }
      ppBVar6 = &pBVar1->nextSlot;
    }
  }
  return (deUint32 *)0x0;
}

Assistant:

BinaryIndexHash::BinaryIndexHash (void)
	: m_hash(BinaryIndexHashImpl_create(m_memPool.getRawPool()))
{
	if (!m_hash)
		throw std::bad_alloc();
}